

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fputcsv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  char *local_88;
  int local_6c;
  char *pcStack_68;
  int n;
  char *z;
  char *pcStack_58;
  int eolen;
  char *zEol;
  io_private *pDev;
  csv_data sCsv;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (((nArg < 2) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) ||
     (iVar1 = jx9_value_is_json_array(apArg[1]), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Missing/Invalid arguments");
    jx9_result_bool(pCtx,0);
  }
  else {
    zEol = (char *)jx9_value_to_resource(*apArg);
    if (((long *)zEol == (long *)0x0) || (*(int *)((long)zEol + 0x34) != 0xfeac14)) {
      jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
      jx9_result_bool(pCtx,0);
    }
    else {
      sCsv._16_8_ = *(undefined8 *)zEol;
      if ((sCsv._16_8_ == 0) || (*(long *)(sCsv._16_8_ + 0x40) == 0)) {
        pcVar2 = jx9_function_name(pCtx);
        if (sCsv._16_8_ == 0) {
          local_88 = "null_stream";
        }
        else {
          local_88 = *(char **)sCsv._16_8_;
        }
        jx9_context_throw_error_format
                  (pCtx,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_88);
        jx9_result_bool(pCtx,0);
      }
      else {
        pDev._0_4_ = 0x2c;
        pDev._4_4_ = 0x22;
        sCsv.pDev._0_4_ = 0;
        sCsv._0_8_ = zEol;
        if (2 < nArg) {
          pcStack_68 = jx9_value_to_string(apArg[2],&local_6c);
          if (0 < local_6c) {
            pDev._0_4_ = (int)*pcStack_68;
          }
          if ((3 < nArg) && (pcStack_68 = jx9_value_to_string(apArg[3],&local_6c), 0 < local_6c)) {
            pDev._4_4_ = (int)*pcStack_68;
          }
        }
        jx9_array_walk(apArg[1],csv_write_callback,&pDev);
        pcStack_58 = "\n";
        z._4_4_ = 1;
        (**(code **)(*(long *)zEol + 0x40))(*(undefined8 *)(zEol + 8),"\n",1);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fputcsv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	struct csv_data sCsv;
	io_private *pDev;
	char *zEol;
	int eolen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_json_array(apArg[1]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Missing/Invalid arguments");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  || pStream->xWrite == 0){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set default csv separator */
	sCsv.delimiter = ',';
	sCsv.enclosure = '"';
	sCsv.pDev = pDev;
	sCsv.iCount = 0;
	if( nArg > 2 ){
		/* User delimiter */
		const char *z;
		int n;
		z = jx9_value_to_string(apArg[2], &n);
		if( n > 0 ){
			sCsv.delimiter = z[0];
		}
		if( nArg > 3 ){
			z = jx9_value_to_string(apArg[3], &n);
			if( n > 0 ){
				sCsv.enclosure = z[0];
			}
		}
	}
	/* Iterate throw array entries and write csv data */
	jx9_array_walk(apArg[1], csv_write_callback, &sCsv);
	/* Write a line ending */
#ifdef __WINNT__
	zEol = "\r\n";
	eolen = (int)sizeof("\r\n")-1;
#else
	/* Assume UNIX LF */
	zEol = "\n";
	eolen = (int)sizeof(char);
#endif
	pDev->pStream->xWrite(pDev->pHandle, (const void *)zEol, eolen);
	return JX9_OK;
}